

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.cpp
# Opt level: O0

uint NULLC::WriteArraySizeAndData<ExternConstantInfo>
               (uchar *target,FastVector<ExternConstantInfo,_false,_false> *arr)

{
  uint size;
  FastVector<ExternConstantInfo,_false,_false> *arr_local;
  uchar *target_local;
  
  *(uint *)target = arr->count;
  memcpy(target + 4,arr->data,(ulong)arr->count * 0xc);
  return arr->count * 0xc + 4;
}

Assistant:

unsigned WriteArraySizeAndData(unsigned char *target, const FastVector<T> &arr)
	{
		memcpy(target, &arr.count, sizeof(unsigned));
		unsigned size = sizeof(unsigned);
		target += sizeof(unsigned);

		memcpy(target, arr.data, arr.count * sizeof(arr.data[0]));
		size += arr.count * sizeof(arr.data[0]);

		return size;
	}